

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O3

object boost::python::detail::
       make_function_aux<long(*)(),boost::python::default_call_policies,boost::mpl::vector1<long>>
                 (_func_long *f,default_call_policies *p,vector1<long> *param_3)

{
  pointer *__ptr;
  py_function local_18;
  
  local_18.m_impl._M_t.
  super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
  .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl =
       (unique_ptr<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18.m_impl._M_t.
   super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
   .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl =
       &PTR__py_function_impl_base_003ec778;
  *(default_call_policies **)
   ((long)local_18.m_impl._M_t.
          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
          .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>.
          _M_head_impl + 8) = p;
  objects::function_object((objects *)f,&local_18);
  if (local_18.m_impl._M_t.
      super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_impl._M_t.
                          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          .
                          super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>
                          ._M_head_impl + 8))();
  }
  return (object)(object_base)f;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }